

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O3

bool __thiscall ConfigReader::parse(ConfigReader *this,istream *configstream)

{
  char cVar1;
  bool bVar2;
  token_t tVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  bool bVar7;
  string tokstr;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  this->m_lineNum = 1;
  if (*(int *)(configstream + *(long *)(*(long *)configstream + -0x18) + 0x20) == 0) {
    this->m_is = configstream;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    cVar1 = std::istream::get();
    this->m_tokchar = cVar1;
    bVar7 = false;
    do {
      tVar3 = tokenize(this,&local_1f8);
      if (bVar7) {
        bVar7 = tVar3 != TOK_EOL;
      }
      else if (tVar3 == TOK_IDENT) {
        iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
        if (iVar4 == 0) {
          bVar2 = parseCorner(this);
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
          if (iVar4 == 0) {
            bVar2 = parseArea(this);
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
            if (iVar4 == 0) {
              bVar2 = parsePad(this);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
              if (iVar4 == 0) {
                bVar2 = parseGrid(this);
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                if (iVar4 == 0) {
                  bVar2 = parseSpace(this);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                  if (iVar4 == 0) {
                    bVar2 = parseFiller(this);
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                    if (iVar4 == 0) {
                      bVar2 = parseOffset(this);
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_1f8);
                      if (iVar4 != 0) {
                        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)(local_1b8 + 0x10),"unrecognized item ",0x12);
                        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)(local_1b8 + 0x10),local_1f8._M_dataplus._M_p
                                            ,local_1f8._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
                        std::__cxx11::stringbuf::str();
                        error(this,&local_1d8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                          operator_delete(local_1d8._M_dataplus._M_p,
                                          local_1d8.field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                        std::ios_base::~ios_base(local_138);
                        goto LAB_00128a6b;
                      }
                      bVar2 = parseDesignName(this);
                    }
                  }
                }
              }
            }
          }
        }
        bVar7 = false;
        bVar6 = false;
        if (bVar2 == false) goto LAB_00128c39;
      }
      else if (tVar3 == TOK_HASH) {
        bVar7 = true;
      }
      else {
        if (tVar3 == TOK_ERR) {
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b8,"Config parse error\n","");
          error(this,(string *)local_1b8);
          if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
            operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
          }
        }
LAB_00128a6b:
        bVar7 = false;
      }
    } while (tVar3 != TOK_EOF);
    bVar6 = true;
LAB_00128c39:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar6 = false;
    doLog(8,"ConfigReader: input stream is not open\n");
  }
  return bVar6;
}

Assistant:

bool ConfigReader::parse(std::istream &configstream)
{
    m_lineNum = 1;

    if (!configstream.good())
    {
        doLog(LOG_ERROR,"ConfigReader: input stream is not open\n");
        return false;
    }

    m_is = &configstream;
    std::string tokstr;
    m_tokchar = m_is->get();

    bool m_inComment = false;
    
    ConfigReader::token_t tok = TOK_EOF;
    do
    {
        tok = tokenize(tokstr);
        if (!m_inComment)
        {   
            switch(tok)
            {
            case TOK_ERR:
                error("Config parse error\n");
                break;
            case TOK_HASH:  // line comment
                m_inComment = true;
                break;
            case TOK_IDENT:
                if (tokstr == "CORNER")
                {
                    if (!parseCorner()) return false;
                }
                else if (tokstr == "AREA")
                {
                    if (!parseArea()) return false;
                }
                else if (tokstr == "PAD")
                {
                    if (!parsePad()) return false;
                }
                else if (tokstr == "GRID")
                {
                    if (!parseGrid()) return false;
                }
                else if (tokstr == "SPACE")
                {
                    if (!parseSpace()) return false;
                }
                else if (tokstr == "FILLER")
                {
                    if (!parseFiller()) return false;
                }                
                else if (tokstr == "OFFSET")
                {
                    if (!parseOffset()) return false;
                }
                else if (tokstr == "DESIGN")
                {
                    if (!parseDesignName()) return false;
                }                
                else
                {
                    std::stringstream ss;
                    ss << "unrecognized item " << tokstr << "\n";
                    error(ss.str());
                }
                break;
            default:
                ;
            }
        }
        else
        {
            if (tok == TOK_EOL)
            {
                m_inComment = false;
            }
        }
    } while(tok != TOK_EOF);

    return true;
}